

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

bool google::protobuf::compiler::objectivec::HasWKTWithObjCCategory(FileDescriptor *file)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  bool bVar1;
  LogMessage *pLVar2;
  LogMessage local_a0;
  Voidify local_89;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_88;
  size_t local_78;
  char *local_70;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_68;
  size_t local_58;
  char *local_50;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_48;
  size_t local_38;
  char *local_30;
  undefined1 local_28 [8];
  string_view name;
  FileDescriptor *file_local;
  
  name._M_str = (char *)file;
  _local_28 = FileDescriptor::name(file);
  local_38 = (size_t)local_28;
  local_30 = (char *)name._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48,"google/protobuf/any.proto");
  __x_01._M_str = local_30;
  __x_01._M_len = local_38;
  bVar1 = std::operator==(__x_01,local_48);
  if (!bVar1) {
    local_58 = (size_t)local_28;
    local_50 = (char *)name._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_68,"google/protobuf/duration.proto");
    __x_00._M_str = local_50;
    __x_00._M_len = local_58;
    bVar1 = std::operator==(__x_00,local_68);
    if (!bVar1) {
      local_78 = (size_t)local_28;
      local_70 = (char *)name._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_88,"google/protobuf/timestamp.proto");
      __x._M_str = local_70;
      __x._M_len = local_78;
      bVar1 = std::operator==(__x,local_88);
      if (!bVar1) {
        return false;
      }
    }
  }
  bVar1 = IsProtobufLibraryBundledProtoFile((FileDescriptor *)name._M_str);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return true;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/helpers.cc"
             ,0x19d,"IsProtobufLibraryBundledProtoFile(file)");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a0);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_89,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_a0);
}

Assistant:

bool HasWKTWithObjCCategory(const FileDescriptor* file) {
  // We don't check the name prefix or proto package because some files
  // (descriptor.proto), aren't shipped generated by the library, so this
  // seems to be the safest way to only catch the ones shipped.
  const absl::string_view name = file->name();
  if (name == "google/protobuf/any.proto" ||
      name == "google/protobuf/duration.proto" ||
      name == "google/protobuf/timestamp.proto") {
    ABSL_DCHECK(IsProtobufLibraryBundledProtoFile(file));
    return true;
  }
  return false;
}